

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_make_huffman_codes(deflate_freqs *freqs,deflate_codes *codes)

{
  u32 *in_stack_00000048;
  u8 *in_stack_00000050;
  u32 *in_stack_00000058;
  uint in_stack_00000060;
  uint in_stack_00000064;
  
  deflate_make_huffman_code
            (in_stack_00000064,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048);
  deflate_make_huffman_code
            (in_stack_00000064,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048);
  return;
}

Assistant:

static void
deflate_make_huffman_codes(const struct deflate_freqs *freqs,
			   struct deflate_codes *codes)
{
	deflate_make_huffman_code(DEFLATE_NUM_LITLEN_SYMS,
				  MAX_LITLEN_CODEWORD_LEN,
				  freqs->litlen,
				  codes->lens.litlen,
				  codes->codewords.litlen);

	deflate_make_huffman_code(DEFLATE_NUM_OFFSET_SYMS,
				  MAX_OFFSET_CODEWORD_LEN,
				  freqs->offset,
				  codes->lens.offset,
				  codes->codewords.offset);
}